

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AVxEncoderThreadRTTest_EncoderResultTest_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AVxEncoderThreadRTTest_EncoderResultTest_Test>
           *this)

{
  AVxEncoderThreadTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (AVxEncoderThreadTest *)operator_new(0x460);
  anon_unknown.dwarf_7c1c5b::AVxEncoderThreadTest::AVxEncoderThreadTest(this_00);
  (this_00->super_CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AVxEncoderThreadTest_0100a1b8;
  (this_00->super_CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_0100a220;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__AVxEncoderThreadRTTest_EncoderResultTest_Test_0100a240;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }